

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-iter.c
# Opt level: O3

void test_bson_iter_overflow(void)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  bson_t *pbVar4;
  undefined4 *puVar5;
  long lVar6;
  undefined8 uVar7;
  undefined1 *puVar8;
  char *pcVar9;
  bson_t *unaff_RBX;
  undefined1 *puVar10;
  undefined8 *puVar11;
  bson_t *pbVar12;
  bson_t *pbVar13;
  bson_t *pbVar14;
  TestSuite *suite;
  ulong uVar15;
  undefined1 *puVar16;
  bson_t *pbVar17;
  ulong uVar18;
  double dVar19;
  undefined1 auVar20 [16];
  bson_iter_t iter;
  undefined1 auStack_3198 [4104];
  bson_t *pbStack_2190;
  code *pcStack_2188;
  undefined8 uStack_2110;
  undefined1 uStack_2108;
  TestSuite aTStack_2100 [5];
  code *pcStack_2008;
  int *piStack_1f90;
  int iStack_1f88;
  undefined1 auStack_1f84 [4];
  undefined1 auStack_1f80 [232];
  bson_t *pbStack_1e98;
  undefined1 *puStack_1e90;
  code *pcStack_1e88;
  bson_t bStack_1e80;
  bson_t abStack_1e00 [2];
  undefined8 uStack_1cc8;
  char *pcStack_1cc0;
  bson_t *pbStack_1cb8;
  undefined8 uStack_1cb0;
  undefined8 uStack_1ca8;
  bson_t *pbStack_1ca0;
  char *pcStack_1c98;
  char *pcStack_1c90;
  code *pcStack_1c88;
  undefined1 auStack_1c80 [128];
  undefined1 auStack_1c00 [232];
  undefined1 *puStack_1b18;
  undefined1 *puStack_1b10;
  code *pcStack_1b08;
  undefined1 auStack_1b00 [128];
  undefined1 auStack_1a80 [368];
  undefined1 *puStack_1910;
  code *pcStack_1908;
  undefined1 auStack_1900 [128];
  undefined1 auStack_1880 [128];
  undefined1 auStack_1800 [128];
  undefined1 auStack_1780 [368];
  undefined8 *puStack_1610;
  code *apcStack_1608 [13];
  undefined8 uStack_15a0;
  undefined8 uStack_1598;
  undefined1 auStack_1590 [16];
  undefined8 auStack_1580 [14];
  undefined8 uStack_1510;
  undefined8 uStack_1508;
  undefined1 auStack_1500 [360];
  undefined1 *puStack_1398;
  undefined1 *puStack_1390;
  code *pcStack_1388;
  undefined1 auStack_1380 [128];
  undefined1 auStack_1300 [368];
  undefined1 *puStack_1190;
  code *pcStack_1188;
  undefined1 auStack_1180 [128];
  undefined1 auStack_1100 [368];
  undefined1 *puStack_f90;
  code *pcStack_f88;
  undefined1 auStack_f80 [128];
  undefined1 auStack_f00 [368];
  undefined1 *puStack_d90;
  code *pcStack_d88;
  undefined1 auStack_d80 [128];
  undefined1 auStack_d00 [368];
  undefined1 *puStack_b90;
  code *pcStack_b88;
  undefined1 auStack_b80 [128];
  undefined1 auStack_b00 [368];
  undefined1 *puStack_990;
  code *pcStack_988;
  undefined1 auStack_980 [128];
  undefined1 auStack_900 [368];
  undefined8 uStack_790;
  code *pcStack_788;
  undefined1 auStack_780 [224];
  undefined8 uStack_6a0;
  undefined1 *puStack_698;
  undefined8 uStack_690;
  code *pcStack_688;
  undefined1 auStack_680 [240];
  undefined1 *puStack_590;
  code *apcStack_588 [15];
  uint uStack_50c;
  uint *puStack_508;
  undefined1 auStack_500 [8];
  uint uStack_4f8;
  int iStack_4f4;
  uint uStack_4d8;
  bson_t *pbStack_3b0;
  code *pcStack_388;
  undefined1 auStack_380 [240];
  bson_t *pbStack_290;
  code *apcStack_288 [15];
  long lStack_210;
  long lStack_208;
  undefined1 auStack_200 [232];
  bson_t *pbStack_118;
  code *pcStack_108;
  undefined1 auStack_100 [240];
  
  pcStack_108 = (code *)0x12aa1e;
  pbVar4 = get_bson(
                   "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson//tests/binary/overflow1.bson"
                   );
  if (pbVar4 == (bson_t *)0x0) {
    pcStack_108 = (code *)0x12aa2f;
    pbVar4 = get_bson(
                     "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson//tests/binary/overflow2.bson"
                     );
    if (pbVar4 == (bson_t *)0x0) goto LAB_0012aa66;
    pcStack_108 = (code *)0x12aa42;
    cVar1 = bson_iter_init(auStack_100,pbVar4);
    unaff_RBX = pbVar4;
    if (cVar1 == '\0') goto LAB_0012aa6b;
    pcStack_108 = (code *)0x12aa4e;
    cVar1 = bson_iter_next(auStack_100);
    if (cVar1 == '\0') {
      pcStack_108 = (code *)0x12aa5a;
      bson_destroy(pbVar4);
      return;
    }
  }
  else {
    pcStack_108 = (code *)0x12aa66;
    test_bson_iter_overflow_cold_1();
LAB_0012aa66:
    pcStack_108 = (code *)0x12aa6b;
    test_bson_iter_overflow_cold_4();
LAB_0012aa6b:
    pcStack_108 = (code *)0x12aa70;
    test_bson_iter_overflow_cold_2();
  }
  pcStack_108 = test_bson_iter_timeval;
  test_bson_iter_overflow_cold_3();
  apcStack_288[0] = (code *)0x12aa93;
  pbStack_118 = unaff_RBX;
  pcStack_108 = (code *)&stack0xfffffffffffffff8;
  pbVar4 = get_bson(
                   "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson//tests/binary/test26.bson"
                   );
  if (pbVar4 == (bson_t *)0x0) {
    apcStack_288[0] = (code *)0x12aafc;
    test_bson_iter_timeval_cold_5();
LAB_0012aafc:
    apcStack_288[0] = (code *)0x12ab01;
    test_bson_iter_timeval_cold_1();
LAB_0012ab01:
    apcStack_288[0] = (code *)0x12ab06;
    test_bson_iter_timeval_cold_2();
LAB_0012ab06:
    apcStack_288[0] = (code *)0x12ab0b;
    test_bson_iter_timeval_cold_3();
  }
  else {
    apcStack_288[0] = (code *)0x12aaab;
    cVar1 = bson_iter_init(auStack_200,pbVar4);
    unaff_RBX = pbVar4;
    if (cVar1 == '\0') goto LAB_0012aafc;
    apcStack_288[0] = (code *)0x12aabc;
    cVar1 = bson_iter_next(auStack_200);
    if (cVar1 == '\0') goto LAB_0012ab01;
    apcStack_288[0] = (code *)0x12aad5;
    bson_iter_timeval(auStack_200,&lStack_210);
    if (lStack_210 != 0x499602d2) goto LAB_0012ab06;
    if (lStack_208 == 0) {
      apcStack_288[0] = (code *)0x12aaee;
      bson_destroy(pbVar4);
      return;
    }
  }
  apcStack_288[0] = test_bson_iter_trailing_null;
  test_bson_iter_timeval_cold_4();
  pcStack_388 = (code *)0x12ab2c;
  pbStack_290 = unaff_RBX;
  apcStack_288[0] = (code *)&pcStack_108;
  pbVar4 = get_bson(
                   "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson//tests/binary/trailingnull.bson"
                   );
  if (pbVar4 == (bson_t *)0x0) {
    pcStack_388 = (code *)0x12ab63;
    test_bson_iter_trailing_null_cold_3();
  }
  else {
    pcStack_388 = (code *)0x12ab3f;
    cVar1 = bson_iter_init(auStack_380,pbVar4);
    unaff_RBX = pbVar4;
    if (cVar1 != '\0') {
      pcStack_388 = (code *)0x12ab4b;
      cVar1 = bson_iter_next(auStack_380);
      if (cVar1 == '\0') {
        pcStack_388 = (code *)0x12ab57;
        bson_destroy(pbVar4);
        return;
      }
      goto LAB_0012ab68;
    }
  }
  pcStack_388 = (code *)0x12ab68;
  test_bson_iter_trailing_null_cold_1();
LAB_0012ab68:
  pcStack_388 = test_bson_iter_fuzz;
  test_bson_iter_trailing_null_cold_2();
  puVar16 = (undefined1 *)0x0;
  uVar18 = 0xfff66;
  pbStack_3b0 = unaff_RBX;
  pcStack_388 = (code *)apcStack_288;
  do {
    apcStack_588[0] = (code *)0x12aba0;
    puVar5 = (undefined4 *)bson_malloc0(0x200);
    *puVar5 = 0x200;
    uVar15 = 0;
    do {
      apcStack_588[0] = (code *)0x12abb1;
      iVar2 = rand();
      *(int *)((long)puVar5 + uVar15 + 4) = iVar2;
      uVar15 = uVar15 + 4;
    } while (uVar15 < 0x1fc);
    apcStack_588[0] = (code *)0x12abd0;
    lVar6 = bson_new_from_data(puVar5,0x200);
    if (lVar6 != 0) {
      apcStack_588[0] = (code *)0x12abe7;
      cVar1 = bson_iter_init(auStack_500,lVar6);
      if (cVar1 == '\0') {
LAB_0012ad0b:
        apcStack_588[0] = (code *)0x12ad10;
        test_bson_iter_fuzz_cold_1();
LAB_0012ad10:
        apcStack_588[0] = (code *)0x12ad15;
        test_bson_iter_fuzz_cold_8();
LAB_0012ad15:
        apcStack_588[0] = (code *)0x12ad1a;
        test_bson_iter_fuzz_cold_4();
LAB_0012ad1a:
        apcStack_588[0] = (code *)0x12ad1f;
        test_bson_iter_fuzz_cold_5();
LAB_0012ad1f:
        apcStack_588[0] = (code *)0x12ad24;
        test_bson_iter_fuzz_cold_7();
LAB_0012ad24:
        apcStack_588[0] = (code *)0x12ad29;
        test_bson_iter_fuzz_cold_6();
LAB_0012ad29:
        apcStack_588[0] = (code *)0x12ad2e;
        test_bson_iter_fuzz_cold_3();
LAB_0012ad2e:
        apcStack_588[0] = test_bson_iter_regex;
        test_bson_iter_fuzz_cold_9();
        pcStack_688 = (code *)0x12ad48;
        puStack_590 = auStack_500;
        apcStack_588[0] = (code *)&pcStack_388;
        uVar7 = bson_new();
        pcStack_688 = (code *)0x12ad6d;
        cVar1 = bson_append_regex(uVar7,"foo",0xffffffff,"^abcd","");
        if (cVar1 == '\0') {
          pcStack_688 = (code *)0x12ae04;
          test_bson_iter_regex_cold_1();
LAB_0012ae04:
          pcStack_688 = (code *)0x12ae09;
          test_bson_iter_regex_cold_2();
LAB_0012ae09:
          pcStack_688 = (code *)0x12ae0e;
          test_bson_iter_regex_cold_3();
LAB_0012ae0e:
          pcStack_688 = (code *)0x12ae13;
          test_bson_iter_regex_cold_4();
LAB_0012ae13:
          pcStack_688 = (code *)0x12ae18;
          test_bson_iter_regex_cold_5();
LAB_0012ae18:
          pcStack_688 = (code *)0x12ae1d;
          test_bson_iter_regex_cold_6();
        }
        else {
          pcStack_688 = (code *)0x12ad93;
          cVar1 = bson_append_regex(uVar7,"foo",0xffffffff,"^abcd",0);
          if (cVar1 == '\0') goto LAB_0012ae04;
          pcStack_688 = (code *)0x12adb9;
          cVar1 = bson_append_regex(uVar7,"foo",0xffffffff,"^abcd","ix");
          if (cVar1 == '\0') goto LAB_0012ae09;
          pcStack_688 = (code *)0x12adc8;
          cVar1 = bson_iter_init(auStack_680,uVar7);
          if (cVar1 == '\0') goto LAB_0012ae0e;
          pcStack_688 = (code *)0x12add4;
          cVar1 = bson_iter_next(auStack_680);
          if (cVar1 == '\0') goto LAB_0012ae13;
          pcStack_688 = (code *)0x12ade0;
          cVar1 = bson_iter_next(auStack_680);
          if (cVar1 == '\0') goto LAB_0012ae18;
          pcStack_688 = (code *)0x12adec;
          cVar1 = bson_iter_next(auStack_680);
          if (cVar1 != '\0') {
            pcStack_688 = (code *)0x12adf8;
            bson_destroy(uVar7);
            return;
          }
        }
        pcStack_688 = test_bson_iter_next_after_finish;
        test_bson_iter_regex_cold_7();
        uStack_690 = 0xfff66;
        pcStack_788 = (code *)0x12ae3b;
        uStack_6a0 = uVar7;
        puStack_698 = puVar16;
        pcStack_688 = (code *)apcStack_588;
        uVar7 = bson_new();
        pcStack_788 = (code *)0x12ae57;
        cVar1 = bson_append_int32(uVar7,"key",0xffffffff,0x4d2);
        if (cVar1 == '\0') goto LAB_0012aea8;
        pcStack_788 = (code *)0x12ae66;
        cVar1 = bson_iter_init(auStack_780,uVar7);
        if (cVar1 == '\0') goto LAB_0012aead;
        pcStack_788 = (code *)0x12ae72;
        cVar1 = bson_iter_next(auStack_780);
        if (cVar1 != '\0') {
          uVar18 = 1000;
          while( true ) {
            pcStack_788 = (code *)0x12ae87;
            cVar1 = bson_iter_next(auStack_780);
            if (cVar1 != '\0') break;
            uVar3 = (int)uVar18 - 1;
            uVar18 = (ulong)uVar3;
            if (uVar3 == 0) {
              pcStack_788 = (code *)0x12ae98;
              bson_destroy(uVar7);
              return;
            }
          }
          pcStack_788 = (code *)0x12aea8;
          test_bson_iter_next_after_finish_cold_4();
          puVar16 = auStack_780;
LAB_0012aea8:
          pcStack_788 = (code *)0x12aead;
          test_bson_iter_next_after_finish_cold_1();
LAB_0012aead:
          pcStack_788 = (code *)0x12aeb2;
          test_bson_iter_next_after_finish_cold_2();
        }
        pcStack_788 = test_bson_iter_find_case;
        test_bson_iter_next_after_finish_cold_3();
        pcStack_988 = (code *)0x12aed7;
        uStack_790 = uVar7;
        pcStack_788 = (code *)&pcStack_688;
        bson_init(auStack_900);
        pcStack_988 = (code *)0x12aef8;
        cVar1 = bson_append_utf8(auStack_900,"key",0xffffffff,"value",0xffffffff);
        if (cVar1 == '\0') {
          pcStack_988 = (code *)0x12af63;
          test_bson_iter_find_case_cold_1();
LAB_0012af63:
          pcStack_988 = (code *)0x12af68;
          test_bson_iter_find_case_cold_2();
LAB_0012af68:
          pcStack_988 = (code *)0x12af6d;
          test_bson_iter_find_case_cold_3();
LAB_0012af6d:
          pcStack_988 = (code *)0x12af72;
          test_bson_iter_find_case_cold_4();
        }
        else {
          pcStack_988 = (code *)0x12af0c;
          cVar1 = bson_iter_init(auStack_980,auStack_900);
          if (cVar1 == '\0') goto LAB_0012af63;
          pcStack_988 = (code *)0x12af1f;
          cVar1 = bson_iter_find_case(auStack_980,"KEY");
          if (cVar1 == '\0') goto LAB_0012af68;
          pcStack_988 = (code *)0x12af33;
          cVar1 = bson_iter_init(auStack_980,auStack_900);
          if (cVar1 == '\0') goto LAB_0012af6d;
          pcStack_988 = (code *)0x12af46;
          cVar1 = bson_iter_find(auStack_980,"KEY");
          if (cVar1 == '\0') {
            pcStack_988 = (code *)0x12af57;
            bson_destroy(auStack_900);
            return;
          }
        }
        pcStack_988 = test_bson_iter_as_double;
        test_bson_iter_find_case_cold_5();
        pcStack_b88 = (code *)0x12af97;
        puStack_990 = auStack_900;
        pcStack_988 = (code *)&pcStack_788;
        bson_init(auStack_b00);
        pcStack_b88 = (code *)0x12afb3;
        cVar1 = bson_append_double(0x4093487e5c91d14e,auStack_b00,"key",0xffffffff);
        if (cVar1 == '\0') {
          pcStack_b88 = (code *)0x12b116;
          test_bson_iter_as_double_cold_1();
LAB_0012b116:
          pcStack_b88 = (code *)0x12b11b;
          test_bson_iter_as_double_cold_2();
LAB_0012b11b:
          pcStack_b88 = (code *)0x12b120;
          test_bson_iter_as_double_cold_3();
LAB_0012b120:
          pcStack_b88 = (code *)0x12b125;
          test_bson_iter_as_double_cold_4();
LAB_0012b125:
          pcStack_b88 = (code *)0x12b12a;
          test_bson_iter_as_double_cold_5();
LAB_0012b12a:
          pcStack_b88 = (code *)0x12b12f;
          test_bson_iter_as_double_cold_6();
LAB_0012b12f:
          pcStack_b88 = (code *)0x12b134;
          test_bson_iter_as_double_cold_7();
LAB_0012b134:
          pcStack_b88 = (code *)0x12b139;
          test_bson_iter_as_double_cold_8();
LAB_0012b139:
          pcStack_b88 = (code *)0x12b13e;
          test_bson_iter_as_double_cold_9();
LAB_0012b13e:
          pcStack_b88 = (code *)0x12b143;
          test_bson_iter_as_double_cold_10();
LAB_0012b143:
          pcStack_b88 = (code *)0x12b148;
          test_bson_iter_as_double_cold_11();
        }
        else {
          pcStack_b88 = (code *)0x12afd2;
          cVar1 = bson_iter_init_find(auStack_b80,auStack_b00,"key");
          if (cVar1 == '\0') goto LAB_0012b116;
          pcStack_b88 = (code *)0x12afe2;
          iVar2 = bson_iter_type(auStack_b80);
          if (iVar2 != 1) goto LAB_0012b11b;
          pcStack_b88 = (code *)0x12aff3;
          dVar19 = (double)bson_iter_as_double(auStack_b80);
          if ((dVar19 != 1234.1234) || (NAN(dVar19))) goto LAB_0012b120;
          pcStack_b88 = (code *)0x12b017;
          bson_destroy(auStack_b00);
          pcStack_b88 = (code *)0x12b01f;
          bson_init(auStack_b00);
          pcStack_b88 = (code *)0x12b038;
          cVar1 = bson_append_int32(auStack_b00,"key",0xffffffff,0x4d2);
          if (cVar1 == '\0') goto LAB_0012b125;
          pcStack_b88 = (code *)0x12b057;
          cVar1 = bson_iter_init_find(auStack_b80,auStack_b00,"key");
          if (cVar1 == '\0') goto LAB_0012b12a;
          pcStack_b88 = (code *)0x12b067;
          iVar2 = bson_iter_type(auStack_b80);
          if (iVar2 != 0x10) goto LAB_0012b12f;
          pcStack_b88 = (code *)0x12b078;
          dVar19 = (double)bson_iter_as_double(auStack_b80);
          if ((dVar19 != 1234.0) || (NAN(dVar19))) goto LAB_0012b134;
          pcStack_b88 = (code *)0x12b09c;
          bson_destroy(auStack_b00);
          pcStack_b88 = (code *)0x12b0a4;
          bson_init(auStack_b00);
          pcStack_b88 = (code *)0x12b0bd;
          cVar1 = bson_append_int64(auStack_b00,"key",0xffffffff,0x10e1);
          if (cVar1 == '\0') goto LAB_0012b139;
          pcStack_b88 = (code *)0x12b0d8;
          cVar1 = bson_iter_init_find(auStack_b80,auStack_b00,"key");
          if (cVar1 == '\0') goto LAB_0012b13e;
          pcStack_b88 = (code *)0x12b0e4;
          iVar2 = bson_iter_type(auStack_b80);
          if (iVar2 != 0x12) goto LAB_0012b143;
          pcStack_b88 = (code *)0x12b0f1;
          dVar19 = (double)bson_iter_as_double(auStack_b80);
          if ((dVar19 == 4321.0) && (!NAN(dVar19))) {
            pcStack_b88 = (code *)0x12b10a;
            bson_destroy(auStack_b00);
            return;
          }
        }
        pcStack_b88 = test_bson_iter_overwrite_int32;
        test_bson_iter_as_double_cold_12();
        puVar8 = auStack_d00;
        pcStack_d88 = (code *)0x12b16d;
        puStack_b90 = auStack_b00;
        pcStack_b88 = (code *)&pcStack_988;
        bson_init(puVar8);
        pcStack_d88 = (code *)0x12b186;
        cVar1 = bson_append_int32(puVar8,"key",0xffffffff,0x4d2);
        if (cVar1 == '\0') {
          pcStack_d88 = (code *)0x12b216;
          test_bson_iter_overwrite_int32_cold_1();
LAB_0012b216:
          pcStack_d88 = (code *)0x12b21b;
          test_bson_iter_overwrite_int32_cold_2();
LAB_0012b21b:
          pcStack_d88 = (code *)0x12b220;
          test_bson_iter_overwrite_int32_cold_3();
LAB_0012b220:
          pcStack_d88 = (code *)0x12b225;
          test_bson_iter_overwrite_int32_cold_4();
LAB_0012b225:
          pcStack_d88 = (code *)0x12b22a;
          test_bson_iter_overwrite_int32_cold_5();
        }
        else {
          pcStack_d88 = (code *)0x12b1a5;
          cVar1 = bson_iter_init_find(auStack_d80,auStack_d00,"key");
          if (cVar1 == '\0') goto LAB_0012b216;
          pcStack_d88 = (code *)0x12b1b1;
          iVar2 = bson_iter_type(auStack_d80);
          if (iVar2 != 0x10) goto LAB_0012b21b;
          pcStack_d88 = (code *)0x12b1c6;
          bson_iter_overwrite_int32(auStack_d80,0x10e1);
          pcStack_d88 = (code *)0x12b1dd;
          cVar1 = bson_iter_init_find(auStack_d80,auStack_d00,"key");
          puVar8 = auStack_d80;
          if (cVar1 == '\0') goto LAB_0012b220;
          pcStack_d88 = (code *)0x12b1e9;
          iVar2 = bson_iter_type(auStack_d80);
          puVar8 = auStack_d80;
          if (iVar2 != 0x10) goto LAB_0012b225;
          pcStack_d88 = (code *)0x12b1f6;
          iVar2 = bson_iter_int32(auStack_d80);
          puVar8 = auStack_d80;
          if (iVar2 == 0x10e1) {
            pcStack_d88 = (code *)0x12b20a;
            bson_destroy(auStack_d00);
            return;
          }
        }
        pcStack_d88 = test_bson_iter_overwrite_int64;
        test_bson_iter_overwrite_int32_cold_6();
        puVar10 = auStack_f00;
        pcStack_f88 = (code *)0x12b24f;
        puStack_d90 = puVar8;
        pcStack_d88 = (code *)&pcStack_b88;
        bson_init(puVar10);
        pcStack_f88 = (code *)0x12b268;
        cVar1 = bson_append_int64(puVar10,"key",0xffffffff,0x4d2);
        if (cVar1 == '\0') {
          pcStack_f88 = (code *)0x12b2f9;
          test_bson_iter_overwrite_int64_cold_1();
LAB_0012b2f9:
          pcStack_f88 = (code *)0x12b2fe;
          test_bson_iter_overwrite_int64_cold_2();
LAB_0012b2fe:
          pcStack_f88 = (code *)0x12b303;
          test_bson_iter_overwrite_int64_cold_3();
LAB_0012b303:
          pcStack_f88 = (code *)0x12b308;
          test_bson_iter_overwrite_int64_cold_4();
LAB_0012b308:
          pcStack_f88 = (code *)0x12b30d;
          test_bson_iter_overwrite_int64_cold_5();
        }
        else {
          pcStack_f88 = (code *)0x12b287;
          cVar1 = bson_iter_init_find(auStack_f80,auStack_f00,"key");
          if (cVar1 == '\0') goto LAB_0012b2f9;
          pcStack_f88 = (code *)0x12b293;
          iVar2 = bson_iter_type(auStack_f80);
          if (iVar2 != 0x12) goto LAB_0012b2fe;
          pcStack_f88 = (code *)0x12b2a8;
          bson_iter_overwrite_int64(auStack_f80,0x1221);
          pcStack_f88 = (code *)0x12b2bf;
          cVar1 = bson_iter_init_find(auStack_f80,auStack_f00,"key");
          puVar10 = auStack_f80;
          if (cVar1 == '\0') goto LAB_0012b303;
          pcStack_f88 = (code *)0x12b2cb;
          iVar2 = bson_iter_type(auStack_f80);
          puVar10 = auStack_f80;
          if (iVar2 != 0x12) goto LAB_0012b308;
          pcStack_f88 = (code *)0x12b2d8;
          lVar6 = bson_iter_int64(auStack_f80);
          puVar10 = auStack_f80;
          if (lVar6 == 0x1221) {
            pcStack_f88 = (code *)0x12b2ed;
            bson_destroy(auStack_f00);
            return;
          }
        }
        pcStack_f88 = test_bson_iter_overwrite_double;
        test_bson_iter_overwrite_int64_cold_6();
        puVar8 = auStack_1100;
        pcStack_1188 = (code *)0x12b332;
        puStack_f90 = puVar10;
        pcStack_f88 = (code *)&pcStack_d88;
        bson_init(puVar8);
        pcStack_1188 = (code *)0x12b34e;
        cVar1 = bson_append_double(0x4093487e5c91d14e,puVar8,"key",0xffffffff);
        if (cVar1 == '\0') {
          pcStack_1188 = (code *)0x12b3e6;
          test_bson_iter_overwrite_double_cold_1();
LAB_0012b3e6:
          pcStack_1188 = (code *)0x12b3eb;
          test_bson_iter_overwrite_double_cold_2();
LAB_0012b3eb:
          pcStack_1188 = (code *)0x12b3f0;
          test_bson_iter_overwrite_double_cold_3();
LAB_0012b3f0:
          pcStack_1188 = (code *)0x12b3f5;
          test_bson_iter_overwrite_double_cold_4();
LAB_0012b3f5:
          pcStack_1188 = (code *)0x12b3fa;
          test_bson_iter_overwrite_double_cold_5();
        }
        else {
          pcStack_1188 = (code *)0x12b36d;
          cVar1 = bson_iter_init_find(auStack_1180,auStack_1100,"key");
          if (cVar1 == '\0') goto LAB_0012b3e6;
          pcStack_1188 = (code *)0x12b379;
          iVar2 = bson_iter_type(auStack_1180);
          if (iVar2 != 1) goto LAB_0012b3eb;
          pcStack_1188 = (code *)0x12b391;
          bson_iter_overwrite_double(0x40b2211f97247454,auStack_1180);
          pcStack_1188 = (code *)0x12b3a8;
          cVar1 = bson_iter_init_find(auStack_1180,auStack_1100,"key");
          puVar8 = auStack_1180;
          if (cVar1 == '\0') goto LAB_0012b3f0;
          pcStack_1188 = (code *)0x12b3b4;
          iVar2 = bson_iter_type(auStack_1180);
          puVar8 = auStack_1180;
          if (iVar2 != 1) goto LAB_0012b3f5;
          pcStack_1188 = (code *)0x12b3c1;
          dVar19 = (double)bson_iter_double(auStack_1180);
          puVar8 = auStack_1180;
          if ((dVar19 == 4641.1234) && (puVar8 = auStack_1180, !NAN(dVar19))) {
            pcStack_1188 = (code *)0x12b3da;
            bson_destroy(auStack_1100);
            return;
          }
        }
        pcStack_1188 = test_bson_iter_overwrite_bool;
        test_bson_iter_overwrite_double_cold_6();
        puVar10 = auStack_1300;
        pcStack_1388 = (code *)0x12b41f;
        puStack_1190 = puVar8;
        pcStack_1188 = (code *)&pcStack_f88;
        bson_init(puVar10);
        pcStack_1388 = (code *)0x12b438;
        cVar1 = bson_append_bool(puVar10,"key",0xffffffff,1);
        if (cVar1 == '\0') {
          pcStack_1388 = (code *)0x12b4be;
          test_bson_iter_overwrite_bool_cold_1();
LAB_0012b4be:
          pcStack_1388 = (code *)0x12b4c3;
          test_bson_iter_overwrite_bool_cold_2();
LAB_0012b4c3:
          pcStack_1388 = (code *)0x12b4c8;
          test_bson_iter_overwrite_bool_cold_3();
LAB_0012b4c8:
          pcStack_1388 = (code *)0x12b4cd;
          test_bson_iter_overwrite_bool_cold_4();
LAB_0012b4cd:
          pcStack_1388 = (code *)0x12b4d2;
          test_bson_iter_overwrite_bool_cold_5();
        }
        else {
          pcStack_1388 = (code *)0x12b453;
          cVar1 = bson_iter_init_find(auStack_1380,auStack_1300,"key");
          if (cVar1 == '\0') goto LAB_0012b4be;
          pcStack_1388 = (code *)0x12b45f;
          iVar2 = bson_iter_type(auStack_1380);
          if (iVar2 != 8) goto LAB_0012b4c3;
          pcStack_1388 = (code *)0x12b471;
          bson_iter_overwrite_bool(auStack_1380,0);
          pcStack_1388 = (code *)0x12b488;
          cVar1 = bson_iter_init_find(auStack_1380,auStack_1300,"key");
          puVar10 = auStack_1380;
          if (cVar1 == '\0') goto LAB_0012b4c8;
          pcStack_1388 = (code *)0x12b494;
          iVar2 = bson_iter_type(auStack_1380);
          puVar10 = auStack_1380;
          if (iVar2 != 8) goto LAB_0012b4cd;
          pcStack_1388 = (code *)0x12b4a1;
          cVar1 = bson_iter_bool(auStack_1380);
          puVar10 = auStack_1380;
          if (cVar1 == '\0') {
            pcStack_1388 = (code *)0x12b4b2;
            bson_destroy(auStack_1300);
            return;
          }
        }
        pcStack_1388 = test_bson_iter_overwrite_decimal128;
        test_bson_iter_overwrite_bool_cold_6();
        puVar11 = &uStack_1510;
        uStack_1508 = 0;
        uStack_1510 = 1;
        uStack_1598 = 0;
        uStack_15a0 = 2;
        puVar8 = auStack_1500;
        apcStack_1608[0] = (code *)0x12b51c;
        puStack_1398 = puVar10;
        puStack_1390 = puVar16;
        pcStack_1388 = (code *)&pcStack_1188;
        bson_init(puVar8);
        apcStack_1608[0] = (code *)0x12b533;
        cVar1 = bson_append_decimal128(puVar8,"key",0xffffffff,puVar11);
        if (cVar1 == '\0') {
          apcStack_1608[0] = (code *)0x12b603;
          test_bson_iter_overwrite_decimal128_cold_1();
LAB_0012b603:
          apcStack_1608[0] = (code *)0x12b608;
          test_bson_iter_overwrite_decimal128_cold_2();
LAB_0012b608:
          apcStack_1608[0] = (code *)0x12b60d;
          test_bson_iter_overwrite_decimal128_cold_3();
LAB_0012b60d:
          apcStack_1608[0] = (code *)0x12b612;
          test_bson_iter_overwrite_decimal128_cold_4();
LAB_0012b612:
          apcStack_1608[0] = (code *)0x12b617;
          test_bson_iter_overwrite_decimal128_cold_5();
LAB_0012b617:
          apcStack_1608[0] = (code *)0x12b61c;
          test_bson_iter_overwrite_decimal128_cold_6();
        }
        else {
          apcStack_1608[0] = (code *)0x12b557;
          cVar1 = bson_iter_init_find(auStack_1580,auStack_1500,"key");
          if (cVar1 == '\0') goto LAB_0012b603;
          apcStack_1608[0] = (code *)0x12b56c;
          iVar2 = bson_iter_type(auStack_1580);
          if (iVar2 != 0x13) goto LAB_0012b608;
          puVar11 = auStack_1580;
          apcStack_1608[0] = (code *)0x12b58a;
          bson_iter_overwrite_decimal128(puVar11,&uStack_15a0);
          apcStack_1608[0] = (code *)0x12b5a1;
          cVar1 = bson_iter_init_find(puVar11,auStack_1500,"key");
          if (cVar1 == '\0') goto LAB_0012b60d;
          apcStack_1608[0] = (code *)0x12b5b2;
          iVar2 = bson_iter_type(auStack_1580);
          if (iVar2 != 0x13) goto LAB_0012b612;
          apcStack_1608[0] = (code *)0x12b5c9;
          cVar1 = bson_iter_decimal128(auStack_1580,auStack_1590);
          if (cVar1 == '\0') goto LAB_0012b617;
          auVar20[0] = -((char)uStack_15a0 == auStack_1590[0]);
          auVar20[1] = -(uStack_15a0._1_1_ == auStack_1590[1]);
          auVar20[2] = -(uStack_15a0._2_1_ == auStack_1590[2]);
          auVar20[3] = -(uStack_15a0._3_1_ == auStack_1590[3]);
          auVar20[4] = -(uStack_15a0._4_1_ == auStack_1590[4]);
          auVar20[5] = -(uStack_15a0._5_1_ == auStack_1590[5]);
          auVar20[6] = -(uStack_15a0._6_1_ == auStack_1590[6]);
          auVar20[7] = -(uStack_15a0._7_1_ == auStack_1590[7]);
          auVar20[8] = -((char)uStack_1598 == auStack_1590[8]);
          auVar20[9] = -(uStack_1598._1_1_ == auStack_1590[9]);
          auVar20[10] = -(uStack_1598._2_1_ == auStack_1590[10]);
          auVar20[0xb] = -(uStack_1598._3_1_ == auStack_1590[0xb]);
          auVar20[0xc] = -(uStack_1598._4_1_ == auStack_1590[0xc]);
          auVar20[0xd] = -(uStack_1598._5_1_ == auStack_1590[0xd]);
          auVar20[0xe] = -(uStack_1598._6_1_ == auStack_1590[0xe]);
          auVar20[0xf] = -(uStack_1598._7_1_ == auStack_1590[0xf]);
          if ((ushort)((ushort)(SUB161(auVar20 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar20 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar20 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar20 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar20 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar20 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar20 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar20 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar20 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar20 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar20 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar20 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar20 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar20 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar20 >> 0x77,0) & 1) << 0xe |
                      (ushort)(auVar20[0xf] >> 7) << 0xf) == 0xffff) {
            apcStack_1608[0] = (code *)0x12b5f5;
            bson_destroy(auStack_1500);
            return;
          }
        }
        apcStack_1608[0] = test_bson_iter_recurse;
        test_bson_iter_overwrite_decimal128_cold_7();
        pcStack_1908 = (code *)0x12b63e;
        puStack_1610 = puVar11;
        apcStack_1608[0] = (code *)&pcStack_1388;
        bson_init(auStack_1780);
        pcStack_1908 = (code *)0x12b64e;
        bson_init(auStack_1880);
        pcStack_1908 = (code *)0x12b664;
        cVar1 = bson_append_int32(auStack_1880,"0",1,0);
        if (cVar1 == '\0') {
          pcStack_1908 = (code *)0x12b79e;
          test_bson_iter_recurse_cold_1();
LAB_0012b79e:
          pcStack_1908 = (code *)0x12b7a3;
          test_bson_iter_recurse_cold_2();
LAB_0012b7a3:
          pcStack_1908 = (code *)0x12b7a8;
          test_bson_iter_recurse_cold_3();
LAB_0012b7a8:
          pcStack_1908 = (code *)0x12b7ad;
          test_bson_iter_recurse_cold_4();
LAB_0012b7ad:
          pcStack_1908 = (code *)0x12b7b2;
          test_bson_iter_recurse_cold_5();
LAB_0012b7b2:
          pcStack_1908 = (code *)0x12b7b7;
          test_bson_iter_recurse_cold_6();
LAB_0012b7b7:
          pcStack_1908 = (code *)0x12b7bc;
          test_bson_iter_recurse_cold_7();
LAB_0012b7bc:
          pcStack_1908 = (code *)0x12b7c1;
          test_bson_iter_recurse_cold_8();
LAB_0012b7c1:
          pcStack_1908 = (code *)0x12b7c6;
          test_bson_iter_recurse_cold_9();
LAB_0012b7c6:
          pcStack_1908 = (code *)0x12b7cb;
          test_bson_iter_recurse_cold_10();
        }
        else {
          pcStack_1908 = (code *)0x12b68a;
          cVar1 = bson_append_int32(auStack_1880,"1",1,1);
          if (cVar1 == '\0') goto LAB_0012b79e;
          pcStack_1908 = (code *)0x12b6b0;
          cVar1 = bson_append_int32(auStack_1880,"2",1,2);
          if (cVar1 == '\0') goto LAB_0012b7a3;
          pcStack_1908 = (code *)0x12b6d9;
          cVar1 = bson_append_array(auStack_1780,"key",0xffffffff,auStack_1880);
          if (cVar1 == '\0') goto LAB_0012b7a8;
          pcStack_1908 = (code *)0x12b6fd;
          cVar1 = bson_iter_init_find(auStack_1800,auStack_1780,"key");
          if (cVar1 == '\0') goto LAB_0012b7ad;
          pcStack_1908 = (code *)0x12b712;
          iVar2 = bson_iter_type(auStack_1800);
          if (iVar2 != 4) goto LAB_0012b7b2;
          pcStack_1908 = (code *)0x12b72b;
          cVar1 = bson_iter_recurse(auStack_1800,auStack_1900);
          if (cVar1 == '\0') goto LAB_0012b7b7;
          pcStack_1908 = (code *)0x12b742;
          cVar1 = bson_iter_find(auStack_1900,"0");
          if (cVar1 == '\0') goto LAB_0012b7bc;
          pcStack_1908 = (code *)0x12b755;
          cVar1 = bson_iter_find(auStack_1900,"1");
          if (cVar1 == '\0') goto LAB_0012b7c1;
          pcStack_1908 = (code *)0x12b768;
          cVar1 = bson_iter_find(auStack_1900,"2");
          if (cVar1 == '\0') goto LAB_0012b7c6;
          pcStack_1908 = (code *)0x12b774;
          cVar1 = bson_iter_next(auStack_1900);
          if (cVar1 == '\0') {
            pcStack_1908 = (code *)0x12b785;
            bson_destroy(auStack_1780);
            pcStack_1908 = (code *)0x12b792;
            bson_destroy(auStack_1880);
            return;
          }
        }
        pcStack_1908 = test_bson_iter_init_find_case;
        test_bson_iter_recurse_cold_11();
        pcStack_1b08 = (code *)0x12b7f0;
        puStack_1910 = auStack_1880;
        pcStack_1908 = (code *)apcStack_1608;
        bson_init(auStack_1a80);
        pcStack_1b08 = (code *)0x12b809;
        cVar1 = bson_append_int32(auStack_1a80,"FOO",0xffffffff,0x4d2);
        if (cVar1 == '\0') {
          pcStack_1b08 = (code *)0x12b850;
          test_bson_iter_init_find_case_cold_1();
LAB_0012b850:
          pcStack_1b08 = (code *)0x12b855;
          test_bson_iter_init_find_case_cold_2();
        }
        else {
          pcStack_1b08 = (code *)0x12b824;
          cVar1 = bson_iter_init_find_case(auStack_1b00,auStack_1a80,"foo");
          if (cVar1 == '\0') goto LAB_0012b850;
          pcStack_1b08 = (code *)0x12b830;
          iVar2 = bson_iter_int32(auStack_1b00);
          if (iVar2 == 0x4d2) {
            pcStack_1b08 = (code *)0x12b844;
            bson_destroy(auStack_1a80);
            return;
          }
        }
        pcStack_1b08 = test_bson_iter_find_descendant;
        test_bson_iter_init_find_case_cold_3();
        pcStack_1c88 = (code *)0x12b878;
        puStack_1b18 = auStack_1a80;
        puStack_1b10 = puVar8;
        pcStack_1b08 = (code *)&pcStack_1908;
        pbVar4 = get_bson(
                         "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson//tests/binary/dotkey.bson"
                         );
        pcStack_1c88 = (code *)0x12b88b;
        cVar1 = bson_iter_init(auStack_1c00,pbVar4);
        if (cVar1 == '\0') {
          pcStack_1c88 = (code *)0x12bab0;
          test_bson_iter_find_descendant_cold_1();
LAB_0012bab0:
          pcStack_1c88 = (code *)0x12bab5;
          test_bson_iter_find_descendant_cold_2();
LAB_0012bab5:
          pcStack_1c88 = (code *)0x12baba;
          test_bson_iter_find_descendant_cold_3();
LAB_0012baba:
          pcStack_1c88 = (code *)0x12babf;
          test_bson_iter_find_descendant_cold_4();
LAB_0012babf:
          pcStack_1c88 = (code *)0x12bac4;
          test_bson_iter_find_descendant_cold_5();
LAB_0012bac4:
          pcStack_1c88 = (code *)0x12bac9;
          test_bson_iter_find_descendant_cold_6();
LAB_0012bac9:
          pcStack_1c88 = (code *)0x12bace;
          test_bson_iter_find_descendant_cold_7();
LAB_0012bace:
          pcStack_1c88 = (code *)0x12bad3;
          test_bson_iter_find_descendant_cold_8();
LAB_0012bad3:
          pcStack_1c88 = (code *)0x12bad8;
          test_bson_iter_find_descendant_cold_9();
LAB_0012bad8:
          pcStack_1c88 = (code *)0x12badd;
          test_bson_iter_find_descendant_cold_10();
LAB_0012badd:
          pcStack_1c88 = (code *)0x12bae2;
          test_bson_iter_find_descendant_cold_11();
LAB_0012bae2:
          pcStack_1c88 = (code *)0x12bae7;
          test_bson_iter_find_descendant_cold_12();
LAB_0012bae7:
          pcStack_1c88 = (code *)0x12baec;
          test_bson_iter_find_descendant_cold_13();
        }
        else {
          pcStack_1c88 = (code *)0x12b8aa;
          cVar1 = bson_iter_find_descendant(auStack_1c00,"a.b.c.0",auStack_1c80);
          if (cVar1 == '\0') goto LAB_0012bab0;
          pcStack_1c88 = (code *)0x12b8ba;
          iVar2 = bson_iter_type(auStack_1c80);
          if (iVar2 != 0x10) goto LAB_0012bab5;
          pcStack_1c88 = (code *)0x12b8cb;
          iVar2 = bson_iter_int32(auStack_1c80);
          if (iVar2 != 1) goto LAB_0012baba;
          pcStack_1c88 = (code *)0x12b8dc;
          bson_destroy(pbVar4);
          pcStack_1c88 = (code *)0x12b8e1;
          pbVar4 = (bson_t *)bson_bcon_magic();
          pcStack_1c88 = (code *)0x0;
          pcStack_1c90 = "}";
          pcStack_1c98 = "]";
          pbStack_1ca0 = (bson_t *)0x14ad57;
          uStack_1ca8 = 1;
          uStack_1cb0 = 0xf;
          pcStack_1cc0 = "baz";
          uStack_1cc8 = 0x12b930;
          pbStack_1cb8 = pbVar4;
          puVar8 = (undefined1 *)bcon_new(0,"foo","{","bar","[","{");
          pcStack_1c88 = (code *)0x12b947;
          cVar1 = bson_iter_init(auStack_1c00,puVar8);
          if (cVar1 == '\0') goto LAB_0012babf;
          pcStack_1c88 = (code *)0x12b966;
          cVar1 = bson_iter_find_descendant(auStack_1c00,"foo.bar.0.baz",auStack_1c80);
          if (cVar1 == '\0') goto LAB_0012bac4;
          pcStack_1c88 = (code *)0x12b976;
          iVar2 = bson_iter_type(auStack_1c80);
          if (iVar2 != 0x10) goto LAB_0012bac9;
          pcStack_1c88 = (code *)0x12b987;
          iVar2 = bson_iter_int32(auStack_1c80);
          if (iVar2 != 1) goto LAB_0012bace;
          pcStack_1c88 = (code *)0x12b998;
          bson_destroy(puVar8);
          pcStack_1c88 = (code *)0x0;
          pcStack_1c90 = (char *)0x2;
          pcStack_1c98 = (char *)0xf;
          uStack_1ca8 = 0x12b9c4;
          pbStack_1ca0 = pbVar4;
          puVar8 = (undefined1 *)bcon_new(0,"nModified",pbVar4,0xf,1,"n");
          pcStack_1c88 = (code *)0x12b9db;
          cVar1 = bson_iter_init(auStack_1c00,puVar8);
          if (cVar1 == '\0') goto LAB_0012bad3;
          pcStack_1c88 = (code *)0x12b9fa;
          cVar1 = bson_iter_find_descendant(auStack_1c00,"n",auStack_1c80);
          if (cVar1 == '\0') goto LAB_0012bad8;
          pcStack_1c88 = (code *)0x12ba0a;
          pcVar9 = (char *)bson_iter_key(auStack_1c80);
          if ((*pcVar9 != 'n') || (pcVar9[1] != '\0')) goto LAB_0012badd;
          pcStack_1c88 = (code *)0x12ba25;
          bson_destroy(puVar8);
          pcStack_1c88 = (code *)0x0;
          pcStack_1c90 = (char *)0x2;
          pcStack_1c98 = (char *)0xf;
          uStack_1ca8 = 0x12ba51;
          pbStack_1ca0 = pbVar4;
          pbVar4 = (bson_t *)bcon_new(0,"",pbVar4,0xf,1,"n");
          pcStack_1c88 = (code *)0x12ba68;
          cVar1 = bson_iter_init(auStack_1c00,pbVar4);
          if (cVar1 == '\0') goto LAB_0012bae2;
          pcStack_1c88 = (code *)0x12ba83;
          cVar1 = bson_iter_find_descendant(auStack_1c00,"n",auStack_1c80);
          if (cVar1 == '\0') goto LAB_0012bae7;
          pcStack_1c88 = (code *)0x12ba8f;
          pcVar9 = (char *)bson_iter_key(auStack_1c80);
          if ((*pcVar9 == 'n') && (pcVar9[1] == '\0')) {
            pcStack_1c88 = (code *)0x12baa2;
            bson_destroy(pbVar4);
            return;
          }
        }
        pcStack_1c88 = test_bson_iter_as_bool;
        test_bson_iter_find_descendant_cold_14();
        pbVar13 = &bStack_1e80;
        pbVar14 = &bStack_1e80;
        pbVar17 = &bStack_1e80;
        pbVar12 = abStack_1e00;
        pcStack_1e88 = (code *)0x12bb15;
        pbStack_1ca0 = pbVar4;
        pcStack_1c98 = puVar8;
        pcStack_1c90 = (char *)uVar18;
        pcStack_1c88 = (code *)&pcStack_1b08;
        bson_init(pbVar12);
        pcStack_1e88 = (code *)0x12bb2e;
        bson_append_int32(pbVar12,"int32[true]",0xffffffff,1);
        pcStack_1e88 = (code *)0x12bb44;
        bson_append_int32(pbVar12,"int32[false]",0xffffffff,0);
        pcStack_1e88 = (code *)0x12bb60;
        bson_append_int64(pbVar12,"int64[true]",0xffffffff,1);
        pcStack_1e88 = (code *)0x12bb79;
        bson_append_int64(pbVar12,"int64[false]",0xffffffff,0);
        pcStack_1e88 = (code *)0x12bb91;
        bson_append_double(0x3ff0000000000000,pbVar12,"int64[true]",0xffffffff);
        pcStack_1e88 = (code *)0x12bba4;
        bson_append_double(pbVar12,"int64[false]",0xffffffff);
        pcStack_1e88 = (code *)0x12bbb2;
        bson_iter_init(&bStack_1e80,pbVar12);
        pcStack_1e88 = (code *)0x12bbba;
        bson_iter_next(&bStack_1e80);
        pcStack_1e88 = (code *)0x12bbc2;
        cVar1 = bson_iter_as_bool(&bStack_1e80);
        if (cVar1 == '\0') {
          pcStack_1e88 = (code *)0x12bc5a;
          test_bson_iter_as_bool_cold_1();
LAB_0012bc5a:
          pcStack_1e88 = (code *)0x12bc5f;
          test_bson_iter_as_bool_cold_6();
LAB_0012bc5f:
          pbVar13 = pbVar12;
          pcStack_1e88 = (code *)0x12bc64;
          test_bson_iter_as_bool_cold_2();
LAB_0012bc64:
          pcStack_1e88 = (code *)0x12bc69;
          test_bson_iter_as_bool_cold_5();
LAB_0012bc69:
          pbVar14 = pbVar13;
          pcStack_1e88 = (code *)0x12bc6e;
          test_bson_iter_as_bool_cold_3();
        }
        else {
          pcStack_1e88 = (code *)0x12bbd5;
          bson_iter_next(&bStack_1e80);
          pcStack_1e88 = (code *)0x12bbdd;
          cVar1 = bson_iter_as_bool(&bStack_1e80);
          pbVar12 = &bStack_1e80;
          if (cVar1 != '\0') goto LAB_0012bc5a;
          pcStack_1e88 = (code *)0x12bbec;
          bson_iter_next(&bStack_1e80);
          pcStack_1e88 = (code *)0x12bbf4;
          cVar1 = bson_iter_as_bool(&bStack_1e80);
          pbVar12 = &bStack_1e80;
          if (cVar1 == '\0') goto LAB_0012bc5f;
          pcStack_1e88 = (code *)0x12bc03;
          bson_iter_next(&bStack_1e80);
          pcStack_1e88 = (code *)0x12bc0b;
          cVar1 = bson_iter_as_bool(&bStack_1e80);
          if (cVar1 != '\0') goto LAB_0012bc64;
          pcStack_1e88 = (code *)0x12bc1a;
          bson_iter_next(&bStack_1e80);
          pcStack_1e88 = (code *)0x12bc22;
          cVar1 = bson_iter_as_bool(&bStack_1e80);
          pbVar13 = &bStack_1e80;
          if (cVar1 == '\0') goto LAB_0012bc69;
          pcStack_1e88 = (code *)0x12bc31;
          bson_iter_next(&bStack_1e80);
          pcStack_1e88 = (code *)0x12bc39;
          cVar1 = bson_iter_as_bool(&bStack_1e80);
          if (cVar1 == '\0') {
            pcStack_1e88 = (code *)0x12bc4a;
            bson_destroy(abStack_1e00);
            return;
          }
        }
        pcStack_1e88 = test_bson_iter_binary_deprecated;
        test_bson_iter_as_bool_cold_4();
        pcStack_2008 = (code *)0x12bc91;
        pbStack_1e98 = pbVar14;
        puStack_1e90 = (undefined1 *)&bStack_1e80;
        pcStack_1e88 = (code *)&pcStack_1c88;
        pbVar4 = get_bson(
                         "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson//tests/binary/binary_deprecated.bson"
                         );
        if (pbVar4 == (bson_t *)0x0) {
          pcStack_2008 = (code *)0x12bd06;
          test_bson_iter_binary_deprecated_cold_5();
LAB_0012bd06:
          pcStack_2008 = (code *)0x12bd0b;
          test_bson_iter_binary_deprecated_cold_1();
LAB_0012bd0b:
          pcStack_2008 = (code *)0x12bd10;
          test_bson_iter_binary_deprecated_cold_2();
LAB_0012bd10:
          pcStack_2008 = (code *)0x12bd15;
          test_bson_iter_binary_deprecated_cold_3();
        }
        else {
          pcStack_2008 = (code *)0x12bca9;
          cVar1 = bson_iter_init(auStack_1f80,pbVar4);
          pbVar14 = pbVar4;
          if (cVar1 == '\0') goto LAB_0012bd06;
          pcStack_2008 = (code *)0x12bcba;
          cVar1 = bson_iter_next(auStack_1f80);
          if (cVar1 == '\0') goto LAB_0012bd0b;
          pbVar17 = (bson_t *)&iStack_1f88;
          pcStack_2008 = (code *)0x12bcdd;
          bson_iter_binary(auStack_1f80,auStack_1f84,pbVar17,&piStack_1f90);
          if (iStack_1f88 != 4) goto LAB_0012bd10;
          if (*piStack_1f90 == 0x34333231) {
            pcStack_2008 = (code *)0x12bcf8;
            bson_destroy(pbVar4);
            return;
          }
        }
        pcStack_2008 = test_bson_iter_from_data;
        test_bson_iter_binary_deprecated_cold_4();
        uStack_2110 = 0x100620800000009;
        uStack_2108 = 0;
        suite = aTStack_2100;
        pcStack_2188 = (code *)0x12bd51;
        pcStack_2008 = (code *)&pcStack_1e88;
        cVar1 = bson_iter_init_from_data(suite,&uStack_2110,9);
        if (cVar1 == '\0') {
          pcStack_2188 = (code *)0x12bd93;
          test_bson_iter_from_data_cold_1();
LAB_0012bd93:
          pcStack_2188 = (code *)0x12bd98;
          test_bson_iter_from_data_cold_2();
LAB_0012bd98:
          pcStack_2188 = (code *)0x12bd9d;
          test_bson_iter_from_data_cold_3();
        }
        else {
          suite = aTStack_2100;
          pcStack_2188 = (code *)0x12bd62;
          cVar1 = bson_iter_next();
          if (cVar1 == '\0') goto LAB_0012bd93;
          suite = aTStack_2100;
          pcStack_2188 = (code *)0x12bd73;
          iVar2 = bson_iter_type();
          if (iVar2 != 8) goto LAB_0012bd98;
          suite = aTStack_2100;
          pcStack_2188 = (code *)0x12bd85;
          cVar1 = bson_iter_bool();
          if (cVar1 != '\0') {
            return;
          }
        }
        pcStack_2188 = get_bson;
        test_bson_iter_from_data_cold_4();
        pbStack_2190 = pbVar14;
        pcStack_2188 = (code *)pbVar17;
        iVar2 = open((char *)suite,0);
        if (iVar2 != -1) {
          uVar18 = read(iVar2,auStack_3198,0x1000);
          if ((long)uVar18 < 0) goto LAB_0012be04;
          if (uVar18 != 0) {
            bson_new_from_data(auStack_3198,uVar18 & 0xffffffff);
            close(iVar2);
            return;
          }
          get_bson_cold_1();
        }
        get_bson_cold_3();
LAB_0012be04:
        get_bson_cold_2();
        TestSuite_Add(suite,"/bson/as_json/x1000",test_bson_as_json_x1000);
        TestSuite_Add(suite,"/bson/as_json/multi",test_bson_as_json_multi);
        TestSuite_Add(suite,"/bson/as_json/string",test_bson_as_json_string);
        TestSuite_Add(suite,"/bson/as_json/int32",test_bson_as_json_int32);
        TestSuite_Add(suite,"/bson/as_json/int64",test_bson_as_json_int64);
        TestSuite_Add(suite,"/bson/as_json/double",test_bson_as_json_double);
        TestSuite_Add(suite,"/bson/as_json/double/nonfinite",test_bson_as_json_double_nonfinite);
        TestSuite_Add(suite,"/bson/as_json/code",test_bson_as_json_code);
        TestSuite_Add(suite,"/bson/as_json/date_time",test_bson_as_json_date_time);
        TestSuite_Add(suite,"/bson/as_json/regex",test_bson_as_json_regex);
        TestSuite_Add(suite,"/bson/as_json/symbol",test_bson_as_json_symbol);
        TestSuite_Add(suite,"/bson/as_json/utf8",test_bson_as_json_utf8);
        TestSuite_Add(suite,"/bson/as_json/dbpointer",test_bson_as_json_dbpointer);
        TestSuite_Add(suite,"/bson/as_canonical_extended_json/dbpointer",
                      test_bson_as_canonical_extended_json_dbpointer);
        TestSuite_Add(suite,"/bson/as_json/stack_overflow",test_bson_as_json_stack_overflow);
        TestSuite_Add(suite,"/bson/as_json/corrupt",test_bson_corrupt);
        TestSuite_Add(suite,"/bson/as_json/corrupt_utf8",test_bson_corrupt_utf8);
        TestSuite_Add(suite,"/bson/as_json/corrupt_binary",test_bson_corrupt_binary);
        TestSuite_Add(suite,"/bson/as_json_spacing",test_bson_as_json_spacing);
        TestSuite_Add(suite,"/bson/array_as_json",test_bson_array_as_json);
        TestSuite_Add(suite,"/bson/json/allow_multiple",test_bson_json_allow_multiple);
        TestSuite_Add(suite,"/bson/json/read/buffering",test_bson_json_read_buffering);
        TestSuite_Add(suite,"/bson/json/read",test_bson_json_read);
        TestSuite_Add(suite,"/bson/json/inc",test_bson_json_inc);
        TestSuite_Add(suite,"/bson/json/array",test_bson_json_array);
        TestSuite_Add(suite,"/bson/json/array/single",test_bson_json_array_single);
        TestSuite_Add(suite,"/bson/json/array/int64",test_bson_json_array_int64);
        TestSuite_Add(suite,"/bson/json/array/subdoc",test_bson_json_array_subdoc);
        TestSuite_Add(suite,"/bson/json/date",test_bson_json_date);
        TestSuite_Add(suite,"/bson/json/date/legacy",test_bson_json_date_legacy);
        TestSuite_Add(suite,"/bson/json/date/long",test_bson_json_date_numberlong);
        TestSuite_Add(suite,"/bson/json/timestamp",test_bson_json_timestamp);
        TestSuite_Add(suite,"/bson/json/read/empty",test_bson_json_read_empty);
        TestSuite_Add(suite,"/bson/json/read/missing_complex",test_bson_json_read_missing_complex);
        TestSuite_Add(suite,"/bson/json/read/invalid_binary",test_bson_json_read_invalid_binary);
        TestSuite_Add(suite,"/bson/json/read/invalid_json",test_bson_json_read_invalid_json);
        TestSuite_Add(suite,"/bson/json/read/bad_cb",test_bson_json_read_bad_cb);
        TestSuite_Add(suite,"/bson/json/read/invalid",test_bson_json_read_invalid);
        TestSuite_Add(suite,"/bson/json/read/raw_utf8",test_bson_json_read_raw_utf8);
        TestSuite_Add(suite,"/bson/json/read/corrupt_utf8",test_bson_json_read_corrupt_utf8);
        TestSuite_Add(suite,"/bson/json/read/decimal128",test_bson_json_read_decimal128);
        TestSuite_Add(suite,"/bson/json/read/dbpointer",test_bson_json_read_dbpointer);
        TestSuite_Add(suite,"/bson/json/read/legacy_regex",test_bson_json_read_legacy_regex);
        TestSuite_Add(suite,"/bson/json/read/regex_options_order",
                      test_bson_json_read_regex_options_order);
        TestSuite_Add(suite,"/bson/json/read/binary",test_bson_json_read_binary);
        TestSuite_Add(suite,"/bson/json/read/legacy_binary",test_bson_json_read_legacy_binary);
        TestSuite_Add(suite,"/bson/json/read/file",test_json_reader_new_from_file);
        TestSuite_Add(suite,"/bson/json/read/bad_path",test_json_reader_new_from_bad_path);
        TestSuite_Add(suite,"/bson/json/read/$numberLong",test_bson_json_number_long);
        TestSuite_Add(suite,"/bson/json/read/$numberLong/zero",test_bson_json_number_long_zero);
        TestSuite_Add(suite,"/bson/json/read/code",test_bson_json_code);
        TestSuite_Add(suite,"/bson/json/read/code/errors",test_bson_json_code_errors);
        TestSuite_Add(suite,"/bson/json/read/dbref",test_bson_json_dbref);
        TestSuite_Add(suite,"/bson/json/read/uescape",test_bson_json_uescape);
        TestSuite_Add(suite,"/bson/json/read/uescape/key",test_bson_json_uescape_key);
        TestSuite_Add(suite,"/bson/json/read/uescape/bad",test_bson_json_uescape_bad);
        TestSuite_Add(suite,"/bson/json/read/int32",test_bson_json_int32);
        TestSuite_Add(suite,"/bson/json/read/int64",test_bson_json_int64);
        TestSuite_Add(suite,"/bson/json/read/double",test_bson_json_double);
        TestSuite_Add(suite,"/bson/json/read/double/overflow",test_bson_json_double_overflow);
        TestSuite_Add(suite,"/bson/json/read/double/nan",test_bson_json_nan);
        TestSuite_Add(suite,"/bson/json/read/double/infinity",test_bson_json_infinity);
        TestSuite_Add(suite,"/bson/json/read/null",test_bson_json_null);
        TestSuite_Add(suite,"/bson/json/read/empty_final",test_bson_json_empty_final_object);
        TestSuite_Add(suite,"/bson/as_json/decimal128",test_bson_as_json_decimal128);
        TestSuite_Add(suite,"/bson/json/read/$numberDecimal",test_bson_json_number_decimal);
        TestSuite_Add(suite,"/bson/json/errors",test_bson_json_errors);
        TestSuite_Add(suite,"/bson/integer/width",test_bson_integer_width);
        TestSuite_Add(suite,"/bson/json/read/null_in_str",test_bson_json_null_in_str);
        TestSuite_Add(suite,"/bson/as_json/multi_object",test_bson_as_json_multi_object);
        return;
      }
LAB_0012abef:
      apcStack_588[0] = (code *)0x12abf7;
      cVar1 = bson_iter_next(auStack_500);
      if (cVar1 != '\0') {
        if (uStack_4d8 < 0x200) {
          apcStack_588[0] = (code *)0x12ac18;
          uVar3 = bson_iter_type(auStack_500);
          if (uVar3 < 0x14) break;
          goto LAB_0012acc1;
        }
        apcStack_588[0] = (code *)0x12ad0b;
        test_bson_iter_fuzz_cold_2();
        goto LAB_0012ad0b;
      }
      apcStack_588[0] = (code *)0x12acdf;
      bson_destroy(lVar6);
    }
    apcStack_588[0] = (code *)0x12ace7;
    bson_free(puVar5);
    uVar3 = (int)puVar16 + 1;
    puVar16 = (undefined1 *)(ulong)uVar3;
    if (uVar3 == 100000) {
      return;
    }
  } while( true );
  if ((0xfff66U >> (uVar3 & 0x1f) & 1) == 0) {
    if ((0x18U >> (uVar3 & 0x1f) & 1) == 0) {
      if (uVar3 == 7) {
        if (uStack_4f8 <= iStack_4f4 + 0xcU) goto LAB_0012ad29;
      }
      else {
LAB_0012acc1:
        if ((uVar3 != 0x7f) && (uVar3 != 0xff)) goto LAB_0012ad2e;
      }
    }
    else {
      puStack_508 = (uint *)0x0;
      uStack_50c = 0;
      apcStack_588[0] = (code *)0x12ac54;
      bson_iter_document(auStack_500,&uStack_50c,&puStack_508);
      if (uStack_50c != 0) {
        if (puStack_508 == (uint *)0x0) goto LAB_0012ad10;
        if (uStack_50c < 5) goto LAB_0012ad15;
        if (*(uint *)(lVar6 + 4) <= iStack_4f4 + uStack_50c) goto LAB_0012ad1a;
        if (uStack_50c == 0xffffffff) goto LAB_0012ad1f;
        uStack_50c = *puStack_508;
        if (uStack_50c < 5) goto LAB_0012ad24;
      }
    }
  }
  goto LAB_0012abef;
}

Assistant:

static void
test_bson_iter_overflow (void)
{
   bson_iter_t iter;
   bson_t *b;

   b = get_bson (BINARY_DIR "/overflow1.bson");
   BSON_ASSERT (!b);

   b = get_bson (BINARY_DIR "/overflow2.bson");
   BSON_ASSERT (b);
   BSON_ASSERT (bson_iter_init (&iter, b));
   BSON_ASSERT (!bson_iter_next (&iter));
   bson_destroy (b);
}